

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator3DnonUniform::
IfcCartesianTransformationOperator3DnonUniform(IfcCartesianTransformationOperator3DnonUniform *this)

{
  IfcCartesianTransformationOperator3DnonUniform *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xb8,"IfcCartesianTransformationOperator3DnonUniform")
  ;
  IfcCartesianTransformationOperator3D::IfcCartesianTransformationOperator3D
            (&this->super_IfcCartesianTransformationOperator3D,&PTR_construction_vtable_24__00f59010
            );
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator3DnonUniform,_2UL>::
  ObjectHelper((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator3DnonUniform,_2UL>
                *)&(this->super_IfcCartesianTransformationOperator3D).field_0x88,
               &PTR_construction_vtable_24__00f590c0);
  (this->super_IfcCartesianTransformationOperator3D).super_IfcCartesianTransformationOperator.
  super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf58f30;
  *(undefined8 *)&this->field_0xb8 = 0xf58ff8;
  *(undefined8 *)
   &(this->super_IfcCartesianTransformationOperator3D).super_IfcCartesianTransformationOperator.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf58f58;
  *(undefined8 *)
   &(this->super_IfcCartesianTransformationOperator3D).super_IfcCartesianTransformationOperator.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf58f80;
  *(undefined8 *)
   &(this->super_IfcCartesianTransformationOperator3D).super_IfcCartesianTransformationOperator.
    field_0x68 = 0xf58fa8;
  *(undefined8 *)&(this->super_IfcCartesianTransformationOperator3D).field_0x88 = 0xf58fd0;
  STEP::Maybe<double>::Maybe
            ((Maybe<double> *)&(this->super_IfcCartesianTransformationOperator3D).field_0x98);
  STEP::Maybe<double>::Maybe(&this->Scale3);
  return;
}

Assistant:

IfcCartesianTransformationOperator3DnonUniform() : Object("IfcCartesianTransformationOperator3DnonUniform") {}